

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFont::ClearOutputData(ImFont *this)

{
  this->FallbackAdvanceX = 0.0;
  this->FontSize = 0.0;
  ImVector<ImFontGlyph>::clear((ImVector<ImFontGlyph> *)&this->Glyphs);
  ImVector<float>::clear((ImVector<float> *)this);
  ImVector<unsigned_short>::clear((ImVector<unsigned_short> *)&this->IndexLookup);
  this->FallbackGlyph = (ImFontGlyph *)0x0;
  this->ContainerAtlas = (ImFontAtlas_conflict *)0x0;
  this->DirtyLookupTables = true;
  this->Ascent = 0.0;
  this->Descent = 0.0;
  this->MetricsTotalSurface = L'\0';
  return;
}

Assistant:

void    ImFont::ClearOutputData()
{
    FontSize = 0.0f;
    FallbackAdvanceX = 0.0f;
    Glyphs.clear();
    IndexAdvanceX.clear();
    IndexLookup.clear();
    FallbackGlyph = NULL;
    ContainerAtlas = NULL;
    DirtyLookupTables = true;
    Ascent = Descent = 0.0f;
    MetricsTotalSurface = 0;
}